

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_362a19::TransformSelectorFor::~TransformSelectorFor(TransformSelectorFor *this)

{
  TransformSelectorIndexes::~TransformSelectorIndexes(&this->super_TransformSelectorIndexes);
  operator_delete(this,0x50);
  return;
}

Assistant:

TransformSelectorFor(int start, int stop, int step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }